

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::forward_int8_x86
          (ConvolutionDepthWise_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int *piVar3;
  void *pvVar4;
  void *pvVar5;
  uint *puVar6;
  float *pfVar7;
  Layer *pLVar8;
  float fVar9;
  float fVar10;
  uint uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined4 uVar16;
  size_t sVar17;
  undefined8 uVar18;
  undefined1 auVar19 [32];
  undefined8 uVar20;
  undefined1 uVar21;
  long lVar22;
  long lVar23;
  int iVar24;
  void *pvVar25;
  float *pfVar26;
  int remain_3;
  int iVar27;
  undefined1 *puVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  undefined4 uVar32;
  long lVar33;
  int iVar34;
  long lVar35;
  ulong uVar36;
  _Vector_base<float,_std::allocator<float>_> *this_00;
  long lVar37;
  undefined1 (*pauVar38) [16];
  undefined1 (*pauVar39) [16];
  void *pvVar40;
  long lVar41;
  int iVar42;
  int k;
  uint _elempack;
  ulong uVar43;
  void *pvVar44;
  undefined4 *puVar45;
  int g;
  int iVar46;
  uint uVar47;
  ulong uVar48;
  int g_2;
  int iVar49;
  uint _elempack_00;
  ulong uVar50;
  void *pvVar51;
  bool bVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  __m128 pos_1;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [64];
  float fVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar105;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar103;
  float fVar104;
  undefined1 auVar102 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar110;
  float fVar131;
  float fVar132;
  __m128 max;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  float fVar133;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  v4sf one;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  __m128 pos;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  ulong local_340;
  float *local_328;
  byte local_308;
  long local_2f0;
  Mat local_2d8;
  ulong local_290;
  Option opt_q;
  float top_rescale;
  int iStack_234;
  Allocator *pAStack_230;
  Allocator *pAStack_228;
  int iStack_220;
  undefined4 uStack_21c;
  Allocator *local_218;
  int iStack_210;
  int iStack_20c;
  int iStack_208;
  int iStack_204;
  int iStack_200;
  undefined4 uStack_1fc;
  size_t local_1f8;
  pointer local_1e8;
  long local_1e0;
  undefined4 *local_1d8;
  void *local_1d0;
  ulong local_1c8;
  long local_1c0;
  ulong local_1b8;
  float scale_out;
  undefined4 uStack_1ac;
  int *local_1a8;
  Allocator *local_1a0;
  int local_198;
  long *local_190;
  int local_188;
  bool bStack_184;
  bool bStack_183;
  bool bStack_182;
  bool bStack_181;
  int iStack_180;
  bool bStack_17c;
  bool bStack_17b;
  bool bStack_17a;
  bool bStack_179;
  int local_178;
  ulong local_170;
  Mat local_168;
  Mat m_1;
  _Vector_base<float,_std::allocator<float>_> local_d8;
  _Vector_base<float,_std::allocator<float>_> local_c0;
  _Vector_base<float,_std::allocator<float>_> local_a8;
  _Vector_base<float,_std::allocator<float>_> local_90;
  Option opt_g;
  
  local_168.c = bottom_blob->c;
  local_168.elempack = bottom_blob->elempack;
  local_168.elemsize = bottom_blob->elemsize;
  iVar27 = (this->super_ConvolutionDepthWise).kernel_w;
  iVar46 = (this->super_ConvolutionDepthWise).kernel_h;
  iVar30 = (this->super_ConvolutionDepthWise).dilation_w;
  iVar42 = (this->super_ConvolutionDepthWise).dilation_h;
  piVar3 = bottom_blob->refcount;
  local_168.data = bottom_blob->data;
  local_168.refcount = bottom_blob->refcount;
  local_168.allocator = bottom_blob->allocator;
  local_168.dims = bottom_blob->dims;
  local_168.w = bottom_blob->w;
  local_168.h = bottom_blob->h;
  local_168.d = bottom_blob->d;
  local_168.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (local_168.elempack == 0 || ((int)local_168.elemsize * 8) / local_168.elempack != 8) {
    iVar49 = local_168.elempack * local_168.c;
    iVar34 = (this->super_ConvolutionDepthWise).group;
    local_2d8.cstep = 0;
    local_2d8.data = (undefined4 *)0x0;
    local_2d8.refcount._0_4_ = 0;
    local_2d8.refcount._4_4_ = 0;
    local_2d8.elemsize = 0;
    local_2d8.elempack = 0;
    local_2d8.allocator = (Allocator *)0x0;
    local_2d8.dims = 0;
    local_2d8.w = 0;
    local_2d8.h = 0;
    local_2d8.d = 0;
    local_2d8.c = 0;
    uVar48 = 0;
    Mat::create(&local_2d8,iVar49,4,(Allocator *)0x0);
    iVar24 = -100;
    iVar49 = iVar49 / iVar34;
    uVar47 = (this->super_ConvolutionDepthWise).group;
    if (iVar49 < 1) {
      iVar49 = 0;
    }
    pvVar4 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
    puVar45 = (undefined4 *)local_2d8.data;
    uVar50 = (ulong)uVar47;
    if ((int)uVar47 < 1) {
      uVar50 = uVar48;
    }
    for (; uVar48 != uVar50; uVar48 = uVar48 + 1) {
      uVar32 = *(undefined4 *)((long)pvVar4 + uVar48 * 4);
      iVar34 = iVar49;
      while (bVar52 = iVar34 != 0, iVar34 = iVar34 + -1, bVar52) {
        *puVar45 = uVar32;
        puVar45 = puVar45 + 1;
      }
    }
    uVar12 = opt->lightmode;
    uVar13 = opt->use_shader_pack8;
    uVar14 = opt->use_subgroup_ops;
    uVar15 = opt->use_reserved_0;
    uVar16 = opt->num_threads;
    opt_q.num_threads = uVar16;
    opt_q.use_reserved_0 = (bool)uVar15;
    opt_q.use_subgroup_ops = (bool)uVar14;
    opt_q.use_shader_pack8 = (bool)uVar13;
    opt_q.lightmode = (bool)uVar12;
    opt_q.workspace_allocator = opt->workspace_allocator;
    opt_q.openmp_blocktime = opt->openmp_blocktime;
    opt_q.use_winograd_convolution = opt->use_winograd_convolution;
    opt_q.use_sgemm_convolution = opt->use_sgemm_convolution;
    opt_q.use_int8_inference = opt->use_int8_inference;
    opt_q.use_vulkan_compute = opt->use_vulkan_compute;
    opt_q.use_bf16_storage = opt->use_bf16_storage;
    opt_q.use_fp16_packed = opt->use_fp16_packed;
    opt_q.use_fp16_storage = opt->use_fp16_storage;
    opt_q.use_fp16_arithmetic = opt->use_fp16_arithmetic;
    opt_q.use_int8_packed = opt->use_int8_packed;
    opt_q.use_int8_storage = opt->use_int8_storage;
    opt_q.use_int8_arithmetic = opt->use_int8_arithmetic;
    opt_q.use_packing_layout = opt->use_packing_layout;
    opt_q.vulkan_device_index = opt->vulkan_device_index;
    opt_q.use_reserved_1 = opt->use_reserved_1;
    opt_q.use_image_storage = opt->use_image_storage;
    opt_q.use_tensor_storage = opt->use_tensor_storage;
    opt_q.use_reserved_2 = opt->use_reserved_2;
    opt_q.flush_denormals = opt->flush_denormals;
    opt_q.use_local_pool_allocator = opt->use_local_pool_allocator;
    opt_q.use_shader_local_memory = opt->use_shader_local_memory;
    opt_q.use_cooperative_matrix = opt->use_cooperative_matrix;
    opt_q.use_winograd23_convolution = opt->use_winograd23_convolution;
    opt_q.use_winograd43_convolution = opt->use_winograd43_convolution;
    opt_q.use_winograd63_convolution = opt->use_winograd63_convolution;
    opt_q.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    opt_q.use_fp16_uniform = opt->use_fp16_uniform;
    opt_q.use_int8_uniform = opt->use_int8_uniform;
    opt_q.use_reserved_9 = opt->use_reserved_9;
    opt_q.use_reserved_10 = opt->use_reserved_10;
    opt_q.use_reserved_11 = opt->use_reserved_11;
    opt_q.blob_allocator = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_168,&local_2d8,&opt_q);
    bVar52 = local_168.data == (void *)0x0;
    lVar35 = (long)local_168.c * local_168.cstep;
    piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_2d8.allocator == (Allocator *)0x0) {
          free(local_2d8.data);
        }
        else {
          (*(local_2d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar52 || lVar35 == 0) goto LAB_003b8592;
  }
  local_2d8.cstep = 0;
  local_2d8.data = (undefined4 *)0x0;
  local_2d8.refcount._0_4_ = 0;
  local_2d8.refcount._4_4_ = 0;
  local_2d8.elemsize = 0;
  local_2d8.elempack = 0;
  local_2d8.allocator = (Allocator *)0x0;
  local_2d8.dims = 0;
  local_2d8.w = 0;
  local_2d8.h = 0;
  local_2d8.d = 0;
  local_2d8.c = 0;
  ConvolutionDepthWise::make_padding(&this->super_ConvolutionDepthWise,&local_168,&local_2d8,opt);
  uVar47 = local_2d8.c;
  iVar49 = local_2d8.w;
  iVar34 = local_2d8.elempack;
  iVar24 = -100;
  if (((undefined4 *)local_2d8.data != (undefined4 *)0x0) &&
     (local_2d8.cstep * (long)local_2d8.c != 0)) {
    iVar27 = (~((iVar27 + -1) * iVar30) + local_2d8.w) / (this->super_ConvolutionDepthWise).stride_w
    ;
    iVar46 = (~((iVar46 + -1) * iVar42) + local_2d8.h) / (this->super_ConvolutionDepthWise).stride_h
    ;
    iVar30 = iVar27 + 1;
    iVar42 = iVar46 + 1;
    uVar29 = local_2d8.elempack * local_2d8.c;
    _elempack_00 = 8;
    if ((uVar29 == (this->super_ConvolutionDepthWise).group) &&
       (uVar29 == (this->super_ConvolutionDepthWise).num_output)) {
      if (opt->use_packing_layout == false) {
        _elempack_00 = 1;
      }
      if ((uVar29 & 7) != 0) {
        _elempack_00 = 1;
      }
      iVar2 = (this->super_ConvolutionDepthWise).int8_scale_term;
      uVar11 = _elempack_00 * 4;
      if (100 < iVar2) {
        uVar11 = _elempack_00;
      }
      Mat::create(top_blob,iVar30,iVar42,(int)uVar29 / (int)_elempack_00,(ulong)uVar11,_elempack_00,
                  opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar24 = 0;
        if (iVar34 == 1) {
          iVar30 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar42 = (this->super_ConvolutionDepthWise).kernel_h;
          auVar96._0_4_ = (this->super_ConvolutionDepthWise).dilation_w;
          auVar96._4_4_ = (this->super_ConvolutionDepthWise).dilation_h;
          auVar96._8_4_ = (this->super_ConvolutionDepthWise).stride_w;
          auVar96._12_4_ = (this->super_ConvolutionDepthWise).stride_h;
          auVar115._8_4_ = 1;
          auVar115._0_8_ = 0x100000001;
          auVar115._12_4_ = 1;
          uVar47 = (this->super_ConvolutionDepthWise).activation_type;
          auVar122._0_8_ = auVar96._0_8_ ^ 0x100000001;
          auVar122._8_4_ = auVar96._8_4_ ^ 1;
          auVar122._12_4_ = auVar96._12_4_ ^ 1;
          if ((1 < uVar47 || (iVar42 != 3 || iVar30 != 3)) || auVar122 != (undefined1  [16])0x0) {
            auVar115 = vpcmpeqd_avx(auVar96,auVar115);
            uVar32 = vmovmskps_avx(auVar115);
            if (((iVar42 != 3 || iVar30 != 3) || 1 < uVar47) ||
                ((auVar96._12_4_ != 2 || auVar96._8_4_ != 2) || (~(byte)uVar32 & 3) != 0)) {
              uVar47 = iVar42 * iVar30;
              local_290 = (ulong)(int)uVar47;
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)&opt_q,local_290,
                         (allocator_type *)&top_rescale);
              iVar30 = (this->super_ConvolutionDepthWise).dilation_h;
              uVar18 = opt_q._0_8_;
              iVar42 = (this->super_ConvolutionDepthWise).kernel_w;
              iVar34 = (this->super_ConvolutionDepthWise).dilation_w * iVar42;
              lVar35 = 0;
              iVar24 = 0;
              for (iVar31 = 0; iVar31 < (this->super_ConvolutionDepthWise).kernel_h;
                  iVar31 = iVar31 + 1) {
                for (lVar37 = 0; (int)lVar37 < iVar42; lVar37 = lVar37 + 1) {
                  *(int *)((long)(int)lVar35 * 4 + opt_q._0_8_ + lVar37 * 4) = iVar24;
                  iVar24 = iVar24 + (this->super_ConvolutionDepthWise).dilation_w;
                  iVar42 = (this->super_ConvolutionDepthWise).kernel_w;
                }
                iVar24 = iVar24 + (iVar49 * iVar30 - iVar34);
                lVar35 = (int)lVar35 + lVar37;
              }
              local_2f0 = 0;
              if ((int)uVar47 < 1) {
                uVar47 = 0;
              }
              auVar69 = ZEXT1664(CONCAT412(0x80000000,CONCAT48(0x80000000,0x8000000080000000)));
              for (lVar35 = 0; pvVar4 = local_2d8.data,
                  lVar35 < (this->super_ConvolutionDepthWise).group; lVar35 = lVar35 + 1) {
                pfVar26 = (float *)(top_blob->elemsize * lVar35 * top_blob->cstep +
                                   (long)top_blob->data);
                lVar22 = local_2d8.cstep * lVar35 * local_2d8.elemsize;
                lVar37 = (long)local_2d8.w * local_2d8.elemsize;
                pvVar5 = (this->weight_data_tm).data;
                local_328 = pfVar26;
                for (iVar30 = 0; iVar30 <= iVar46; iVar30 = iVar30 + 1) {
                  for (iVar42 = 0; iVar42 <= iVar27; iVar42 = iVar42 + 1) {
                    iVar34 = 0;
                    for (uVar48 = 0; uVar47 != uVar48; uVar48 = uVar48 + 1) {
                      iVar34 = iVar34 + (int)*(char *)((long)pvVar5 + uVar48 + local_2f0) *
                                        (int)*(char *)((long)pvVar4 +
                                                      (long)*(int *)(uVar18 + uVar48 * 4) +
                                                      (long)iVar30 *
                                                      (long)(this->super_ConvolutionDepthWise).
                                                            stride_h * lVar37 +
                                                      (long)iVar42 *
                                                      (long)(this->super_ConvolutionDepthWise).
                                                            stride_w + lVar22);
                    }
                    fVar54 = *(float *)((long)(this->super_ConvolutionDepthWise).
                                              weight_data_int8_scales.data + lVar35 * 4);
                    fVar53 = 0.0;
                    if (fVar54 != 0.0) {
                      fVar53 = 1.0 / (fVar54 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                                bottom_blob_int8_scales.data +
                                                         lVar35 * 4));
                    }
                    fVar53 = fVar53 * (float)iVar34;
                    if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                      fVar53 = fVar53 + *(float *)((long)(this->super_ConvolutionDepthWise).
                                                         bias_data.data + lVar35 * 4);
                    }
                    auVar96 = ZEXT416((uint)fVar53);
                    fVar54 = fVar53;
                    switch((this->super_ConvolutionDepthWise).activation_type) {
                    case 1:
                      auVar96 = vmaxss_avx(auVar96,ZEXT416(0));
                      fVar54 = auVar96._0_4_;
                      break;
                    case 2:
                      auVar96 = vcmpss_avx(ZEXT816(0) << 0x20,auVar96,1);
                      auVar67._8_4_ = 0x3f800000;
                      auVar67._0_8_ = 0x3f8000003f800000;
                      auVar67._12_4_ = 0x3f800000;
                      auVar96 = vblendvps_avx(ZEXT416(*(this->super_ConvolutionDepthWise).
                                                       activation_params.data),auVar67,auVar96);
                      fVar55 = auVar96._0_4_;
LAB_003b78d9:
                      fVar54 = fVar55 * fVar53;
                      break;
                    case 3:
                      puVar6 = (uint *)(this->super_ConvolutionDepthWise).activation_params.data;
                      fVar53 = (float)puVar6[1];
                      auVar96 = vmaxss_avx(auVar96,ZEXT416(*puVar6));
                      fVar54 = auVar96._0_4_;
                      if (fVar53 < auVar96._0_4_) {
                        fVar54 = fVar53;
                      }
                      break;
                    case 4:
                      auVar96 = vminss_avx(auVar96,ZEXT416(0x42b0c0a5));
                      auVar138._0_4_ = auVar96._0_4_ ^ auVar69._0_4_;
                      auVar138._4_4_ = auVar96._4_4_ ^ auVar69._4_4_;
                      auVar138._8_4_ = auVar96._8_4_ ^ auVar69._8_4_;
                      auVar138._12_4_ = auVar96._12_4_ ^ auVar69._12_4_;
                      auVar96 = vcmpss_avx(auVar96,ZEXT416(0xc2b0c0a5),1);
                      auVar66._8_4_ = 0x42b0c0a5;
                      auVar66._0_8_ = 0x42b0c0a542b0c0a5;
                      auVar66._12_4_ = 0x42b0c0a5;
                      auVar96 = vblendvps_avx(auVar138,auVar66,auVar96);
                      fVar54 = expf(auVar96._0_4_);
                      auVar69 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      fVar54 = 1.0 / (fVar54 + 1.0);
                      break;
                    case 5:
                      fVar54 = expf(fVar53);
                      fVar54 = logf(fVar54 + 1.0);
                      fVar54 = tanhf(fVar54);
                      auVar69 = ZEXT1664(CONCAT412(0x80000000,
                                                   CONCAT48(0x80000000,0x8000000080000000)));
                      fVar54 = fVar54 * fVar53;
                      break;
                    case 6:
                      pfVar7 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                      fVar1 = *pfVar7;
                      fVar55 = pfVar7[1];
                      fVar85 = (float)((uint)fVar55 ^ auVar69._0_4_) / fVar1;
                      fVar54 = 0.0;
                      if ((fVar85 <= fVar53) && (fVar54 = fVar53, fVar53 <= fVar85 + 1.0 / fVar1)) {
                        fVar55 = fVar1 * fVar53 + fVar55;
                        goto LAB_003b78d9;
                      }
                    }
                    if (iVar2 < 0x65) {
                      *local_328 = fVar54;
                      local_328 = local_328 + 1;
                    }
                    else {
                      fVar54 = fVar54 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                         top_blob_int8_scales.data + lVar35 * 4);
                      auVar96 = vandps_avx(ZEXT416((uint)fVar54),auVar69._0_16_);
                      auVar68._8_4_ = 0x3effffff;
                      auVar68._0_8_ = 0x3effffff3effffff;
                      auVar68._12_4_ = 0x3effffff;
                      auVar96 = vorps_avx(auVar96,auVar68);
                      auVar96 = ZEXT416((uint)(fVar54 + auVar96._0_4_));
                      auVar96 = vroundss_avx(auVar96,auVar96,0xb);
                      iVar34 = (int)auVar96._0_4_;
                      if (iVar34 < -0x7e) {
                        iVar34 = -0x7f;
                      }
                      uVar21 = (undefined1)iVar34;
                      if (0x7e < iVar34) {
                        uVar21 = 0x7f;
                      }
                      *(undefined1 *)pfVar26 = uVar21;
                      pfVar26 = (float *)((long)pfVar26 + 1);
                    }
                  }
                }
                local_2f0 = local_2f0 + local_290;
              }
              goto LAB_003b79b3;
            }
            if (iVar2 < 0x65) {
              opt_q._0_16_ = ZEXT816(0) << 0x20;
              opt_q.workspace_allocator = (Allocator *)0x0;
              for (lVar35 = 0; lVar35 < (this->super_ConvolutionDepthWise).group;
                  lVar35 = lVar35 + 1) {
                _top_rescale = (void *)CONCAT44(iStack_234,
                                                1.0 / (*(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  weight_data_int8_scales.data + lVar35 * 4) *
                                                  *(float *)((long)(this->super_ConvolutionDepthWise
                                                                   ).bottom_blob_int8_scales.data +
                                                            lVar35 * 4)));
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_d8,
                         (vector<float,_std::allocator<float>_> *)&opt_q);
              iVar27 = top_blob->w;
              iVar46 = top_blob->h;
              pvVar4 = (this->super_ConvolutionDepthWise).bias_data.data;
              pvVar5 = (this->weight_data_tm).data;
              uVar48 = top_blob->elemsize;
              lVar35 = top_blob->cstep * uVar48;
              local_290 = (long)iVar46 * (long)iVar27;
              local_1b8 = uVar48 * local_290 + 0xf & 0xfffffffffffffff0;
              local_1c0 = local_2d8.elemsize * local_2d8.cstep;
              iVar30 = 0;
              if (0 < iVar46) {
                iVar30 = iVar46;
              }
              iVar46 = top_blob->d;
              local_1c8 = CONCAT44(local_1c8._4_4_,iVar46);
              local_1d0 = top_blob->data;
              lVar37 = (long)((local_2d8.w - iVar27) * 2);
              uVar47 = top_blob->c;
              if (top_blob->c < 1) {
                uVar47 = 0;
              }
              iVar42 = top_blob->dims;
              local_1d8 = (undefined4 *)local_2d8.data;
              local_1e0 = (long)local_2d8.w * 2;
              local_1e8 = local_d8._M_impl.super__Vector_impl_data._M_start;
              pvVar51 = local_1d0;
              for (uVar50 = 0; uVar50 != uVar47; uVar50 = uVar50 + 1) {
                iVar34 = (int)(local_1b8 / uVar48);
                if (iVar42 == 4) {
                  iVar34 = (int)local_290;
                }
                if (pvVar4 == (void *)0x0) {
                  uVar32 = 0;
                }
                else {
                  uVar32 = *(undefined4 *)((long)pvVar4 + uVar50 * 4);
                }
                pfVar26 = (float *)(lVar35 * uVar50 + (long)local_1d0);
                fVar54 = local_d8._M_impl.super__Vector_impl_data._M_start[uVar50];
                iVar34 = iVar34 * iVar46;
                if (iVar34 < 1) {
                  iVar34 = 0;
                }
                for (lVar22 = 0; iVar34 != (int)lVar22; lVar22 = lVar22 + 1) {
                  *(undefined4 *)((long)pvVar51 + lVar22 * 4) = uVar32;
                }
                lVar23 = uVar50 * 9;
                puVar45 = (undefined4 *)(local_1c0 * uVar50 + (long)local_2d8.data);
                lVar22 = (long)puVar45 + (long)local_2d8.w;
                lVar33 = (long)puVar45 + local_1e0;
                for (iVar34 = 0; iVar34 != iVar30; iVar34 = iVar34 + 1) {
                  lVar41 = 0;
                  for (iVar49 = iVar27; 0 < iVar49; iVar49 = iVar49 + -1) {
                    *pfVar26 = fVar54 * (float)((int)*(char *)((long)pvVar5 + lVar23 + 8) *
                                                (int)*(char *)(lVar33 + 2 + lVar41) +
                                                (int)*(char *)((long)pvVar5 + lVar23 + 7) *
                                                (int)*(char *)(lVar33 + 1 + lVar41) +
                                               (int)*(char *)((long)pvVar5 + lVar23 + 6) *
                                               (int)*(char *)(lVar33 + lVar41) +
                                               (int)*(char *)((long)pvVar5 + lVar23 + 5) *
                                               (int)*(char *)(lVar22 + 2 + lVar41) +
                                               (int)*(char *)((long)pvVar5 + lVar23 + 4) *
                                               (int)*(char *)(lVar22 + 1 + lVar41) +
                                               (int)*(char *)((long)pvVar5 + lVar23 + 3) *
                                               (int)*(char *)(lVar22 + lVar41) +
                                               (int)*(char *)((long)pvVar5 + lVar23 + 2) *
                                               (int)*(char *)((long)puVar45 + lVar41 + 2) +
                                               (int)*(char *)((long)pvVar5 + lVar23 + 1) *
                                               (int)*(char *)((long)puVar45 + lVar41 + 1) +
                                               (int)*(char *)((long)pvVar5 + lVar23) *
                                               (int)*(char *)((long)puVar45 + lVar41)) + *pfVar26;
                    pfVar26 = pfVar26 + 1;
                    lVar41 = lVar41 + 2;
                  }
                  puVar45 = (undefined4 *)((long)puVar45 + lVar41 + lVar37);
                  lVar22 = lVar22 + lVar37 + lVar41;
                  lVar33 = lVar33 + lVar37 + lVar41;
                }
                pvVar51 = (void *)((long)pvVar51 + lVar35);
              }
              this_00 = &local_d8;
            }
            else {
              opt_q._0_16_ = ZEXT816(0) << 0x20;
              opt_q.workspace_allocator = (Allocator *)0x0;
              for (lVar35 = 0; lVar35 < (this->super_ConvolutionDepthWise).group;
                  lVar35 = lVar35 + 1) {
                fVar54 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales
                                          .data + lVar35 * 4);
                fVar53 = 0.0;
                if (fVar54 != 0.0) {
                  fVar53 = 1.0 / (fVar54 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                            bottom_blob_int8_scales.data +
                                                     lVar35 * 4));
                }
                _top_rescale = (void *)CONCAT44(iStack_234,fVar53);
                _scale_out = (void *)CONCAT44(uStack_1ac,
                                              *(undefined4 *)
                                               ((long)(this->super_ConvolutionDepthWise).
                                                      top_blob_int8_scales.data + lVar35 * 4));
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
                std::vector<float,_std::allocator<float>_>::push_back
                          ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
              }
              std::vector<float,_std::allocator<float>_>::vector
                        ((vector<float,_std::allocator<float>_> *)&local_c0,
                         (vector<float,_std::allocator<float>_> *)&opt_q);
              iVar27 = top_blob->w;
              iVar46 = top_blob->h;
              pvVar4 = (this->super_ConvolutionDepthWise).bias_data.data;
              pvVar5 = (this->weight_data_tm).data;
              lVar35 = (long)((local_2d8.w - iVar27) * 2);
              uVar48 = 0;
              if (iVar46 < 1) {
                iVar46 = 0;
              }
              uVar50 = (ulong)(uint)top_blob->c;
              if (top_blob->c < 1) {
                uVar50 = uVar48;
              }
              auVar57._8_4_ = 0x80000000;
              auVar57._0_8_ = 0x8000000080000000;
              auVar57._12_4_ = 0x80000000;
              auVar65._8_4_ = 0x3effffff;
              auVar65._0_8_ = 0x3effffff3effffff;
              auVar65._12_4_ = 0x3effffff;
              for (; uVar48 != uVar50; uVar48 = uVar48 + 1) {
                if (pvVar4 == (void *)0x0) {
                  fVar54 = 0.0;
                }
                else {
                  fVar54 = *(float *)((long)pvVar4 + uVar48 * 4);
                }
                puVar28 = (undefined1 *)
                          (top_blob->cstep * uVar48 * top_blob->elemsize + (long)top_blob->data);
                fVar53 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar48 * 2];
                fVar1 = local_c0._M_impl.super__Vector_impl_data._M_start[uVar48 * 2 + 1];
                puVar45 = (undefined4 *)
                          (local_2d8.cstep * uVar48 * local_2d8.elemsize + (long)local_2d8.data);
                lVar33 = uVar48 * 9;
                lVar37 = (long)puVar45 + (long)local_2d8.w;
                lVar22 = (long)puVar45 + (long)local_2d8.w * 2;
                for (iVar30 = 0; iVar30 != iVar46; iVar30 = iVar30 + 1) {
                  lVar23 = 0;
                  for (iVar42 = iVar27; 0 < iVar42; iVar42 = iVar42 + -1) {
                    fVar55 = (fVar53 * (float)((int)*(char *)((long)pvVar5 + lVar33 + 8) *
                                               (int)*(char *)(lVar22 + 2 + lVar23) +
                                               (int)*(char *)((long)pvVar5 + lVar33 + 7) *
                                               (int)*(char *)(lVar22 + 1 + lVar23) +
                                              (int)*(char *)((long)pvVar5 + lVar33 + 6) *
                                              (int)*(char *)(lVar22 + lVar23) +
                                              (int)*(char *)((long)pvVar5 + lVar33 + 5) *
                                              (int)*(char *)(lVar37 + 2 + lVar23) +
                                              (int)*(char *)((long)pvVar5 + lVar33 + 4) *
                                              (int)*(char *)(lVar37 + 1 + lVar23) +
                                              (int)*(char *)((long)pvVar5 + lVar33 + 3) *
                                              (int)*(char *)(lVar37 + lVar23) +
                                              (int)*(char *)((long)pvVar5 + lVar33 + 2) *
                                              (int)*(char *)((long)puVar45 + lVar23 + 2) +
                                              (int)*(char *)((long)pvVar5 + lVar33 + 1) *
                                              (int)*(char *)((long)puVar45 + lVar23 + 1) +
                                              (int)*(char *)((long)pvVar5 + lVar33) *
                                              (int)*(char *)((long)puVar45 + lVar23)) + fVar54) *
                             fVar1;
                    auVar96 = vandps_avx(ZEXT416((uint)fVar55),auVar57);
                    auVar96 = vorps_avx(auVar96,auVar65);
                    auVar96 = ZEXT416((uint)(fVar55 + auVar96._0_4_));
                    auVar96 = vroundss_avx(auVar96,auVar96,0xb);
                    iVar34 = (int)auVar96._0_4_;
                    if (iVar34 < -0x7e) {
                      iVar34 = -0x7f;
                    }
                    if (0x7e < iVar34) {
                      iVar34 = 0x7f;
                    }
                    *puVar28 = (char)iVar34;
                    puVar28 = puVar28 + 1;
                    lVar23 = lVar23 + 2;
                  }
                  puVar45 = (undefined4 *)((long)puVar45 + lVar23 + lVar35);
                  lVar37 = lVar37 + lVar35 + lVar23;
                  lVar22 = lVar22 + lVar35 + lVar23;
                }
              }
              this_00 = &local_c0;
            }
          }
          else if (iVar2 < 0x65) {
            opt_q._0_16_ = ZEXT816(0) << 0x20;
            opt_q.workspace_allocator = (Allocator *)0x0;
            for (lVar35 = 0; lVar35 < (this->super_ConvolutionDepthWise).group; lVar35 = lVar35 + 1)
            {
              _top_rescale = (void *)CONCAT44(iStack_234,
                                              1.0 / (*(float *)((long)(this->
                                                  super_ConvolutionDepthWise).
                                                  weight_data_int8_scales.data + lVar35 * 4) *
                                                  *(float *)((long)(this->super_ConvolutionDepthWise
                                                                   ).bottom_blob_int8_scales.data +
                                                            lVar35 * 4)));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_a8,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar27 = top_blob->w;
            iVar46 = top_blob->h;
            pvVar4 = (this->super_ConvolutionDepthWise).bias_data.data;
            pvVar5 = (this->weight_data_tm).data;
            iVar30 = top_blob->d;
            pvVar51 = top_blob->data;
            local_290 = top_blob->elemsize;
            local_1b8 = top_blob->cstep * local_290;
            local_1c0 = (long)iVar46 * (long)iVar27;
            local_1c8 = local_290 * local_1c0 + 0xf & 0xfffffffffffffff0;
            local_1d0 = (void *)(local_2d8.elemsize * local_2d8.cstep);
            iVar42 = 0;
            if (0 < iVar46) {
              iVar42 = iVar46;
            }
            iVar46 = top_blob->dims;
            uVar47 = top_blob->c;
            if (top_blob->c < 1) {
              uVar47 = 0;
            }
            local_1d8 = (undefined4 *)local_2d8.data;
            local_1e0 = (long)local_2d8.w * 2;
            local_1e8 = local_a8._M_impl.super__Vector_impl_data._M_start;
            pvVar40 = pvVar51;
            for (uVar48 = 0; uVar48 != uVar47; uVar48 = uVar48 + 1) {
              iVar34 = (int)(local_1c8 / local_290);
              if (iVar46 == 4) {
                iVar34 = (int)local_1c0;
              }
              if (pvVar4 == (void *)0x0) {
                uVar32 = 0;
              }
              else {
                uVar32 = *(undefined4 *)((long)pvVar4 + uVar48 * 4);
              }
              fVar54 = local_a8._M_impl.super__Vector_impl_data._M_start[uVar48];
              iVar34 = iVar34 * iVar30;
              if (iVar34 < 1) {
                iVar34 = 0;
              }
              for (lVar35 = 0; iVar34 != (int)lVar35; lVar35 = lVar35 + 1) {
                *(undefined4 *)((long)pvVar40 + lVar35 * 4) = uVar32;
              }
              lVar22 = uVar48 * 9;
              puVar45 = (undefined4 *)((long)local_1d0 * uVar48 + (long)local_2d8.data);
              lVar35 = (long)local_2d8.w + (long)puVar45;
              lVar37 = local_1e0 + (long)puVar45;
              pvVar44 = (void *)(local_1b8 * uVar48 + (long)pvVar51);
              for (iVar34 = 0; iVar34 != iVar42; iVar34 = iVar34 + 1) {
                lVar33 = 0;
                pvVar25 = pvVar44;
                for (uVar50 = (long)iVar27; 0 < (int)uVar50; uVar50 = (ulong)((int)uVar50 - 1)) {
                  *(float *)((long)pvVar44 + lVar33 * 4) =
                       fVar54 * (float)((int)*(char *)((long)pvVar5 + lVar22 + 8) *
                                        (int)*(char *)(lVar37 + 2 + lVar33) +
                                        (int)*(char *)((long)pvVar5 + lVar22 + 7) *
                                        (int)*(char *)(lVar37 + 1 + lVar33) +
                                       (int)*(char *)((long)pvVar5 + lVar22 + 6) *
                                       (int)*(char *)(lVar37 + lVar33) +
                                       (int)*(char *)((long)pvVar5 + lVar22 + 5) *
                                       (int)*(char *)(lVar35 + 2 + lVar33) +
                                       (int)*(char *)((long)pvVar5 + lVar22 + 4) *
                                       (int)*(char *)(lVar35 + 1 + lVar33) +
                                       (int)*(char *)((long)pvVar5 + lVar22 + 3) *
                                       (int)*(char *)(lVar35 + lVar33) +
                                       (int)*(char *)((long)pvVar5 + lVar22 + 2) *
                                       (int)*(char *)((long)puVar45 + lVar33 + 2) +
                                       (int)*(char *)((long)pvVar5 + lVar22 + 1) *
                                       (int)*(char *)((long)puVar45 + lVar33 + 1) +
                                       (int)*(char *)((long)pvVar5 + lVar22) *
                                       (int)*(char *)((long)puVar45 + lVar33)) +
                       *(float *)((long)pvVar44 + lVar33 * 4);
                  pvVar25 = (void *)((long)pvVar25 + 4);
                  lVar33 = lVar33 + 1;
                }
                puVar45 = (undefined4 *)((long)puVar45 + lVar33 + 2);
                lVar35 = lVar35 + lVar33 + 2;
                lVar37 = lVar37 + lVar33 + 2;
                pvVar44 = pvVar25;
              }
              pvVar40 = (void *)((long)pvVar40 + local_1b8);
            }
            this_00 = &local_a8;
          }
          else {
            opt_q._0_16_ = ZEXT816(0) << 0x20;
            opt_q.workspace_allocator = (Allocator *)0x0;
            for (lVar35 = 0; lVar35 < (this->super_ConvolutionDepthWise).group; lVar35 = lVar35 + 1)
            {
              fVar54 = *(float *)((long)(this->super_ConvolutionDepthWise).weight_data_int8_scales.
                                        data + lVar35 * 4);
              fVar53 = 0.0;
              if (fVar54 != 0.0) {
                fVar53 = 1.0 / (fVar54 * *(float *)((long)(this->super_ConvolutionDepthWise).
                                                          bottom_blob_int8_scales.data + lVar35 * 4)
                               );
              }
              _top_rescale = (void *)CONCAT44(iStack_234,fVar53);
              _scale_out = (void *)CONCAT44(uStack_1ac,
                                            *(undefined4 *)
                                             ((long)(this->super_ConvolutionDepthWise).
                                                    top_blob_int8_scales.data + lVar35 * 4));
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&top_rescale);
              std::vector<float,_std::allocator<float>_>::push_back
                        ((vector<float,_std::allocator<float>_> *)&opt_q,&scale_out);
            }
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)&local_90,
                       (vector<float,_std::allocator<float>_> *)&opt_q);
            iVar27 = top_blob->w;
            iVar46 = top_blob->h;
            pvVar4 = (this->super_ConvolutionDepthWise).bias_data.data;
            pvVar5 = (this->weight_data_tm).data;
            uVar48 = 0;
            if (iVar46 < 1) {
              iVar46 = 0;
            }
            uVar50 = (ulong)(uint)top_blob->c;
            if (top_blob->c < 1) {
              uVar50 = uVar48;
            }
            auVar56._8_4_ = 0x80000000;
            auVar56._0_8_ = 0x8000000080000000;
            auVar56._12_4_ = 0x80000000;
            auVar64._8_4_ = 0x3effffff;
            auVar64._0_8_ = 0x3effffff3effffff;
            auVar64._12_4_ = 0x3effffff;
            for (; uVar48 != uVar50; uVar48 = uVar48 + 1) {
              if (pvVar4 == (void *)0x0) {
                fVar54 = 0.0;
              }
              else {
                fVar54 = *(float *)((long)pvVar4 + uVar48 * 4);
              }
              pvVar51 = (void *)(top_blob->cstep * uVar48 * top_blob->elemsize +
                                (long)top_blob->data);
              fVar53 = local_90._M_impl.super__Vector_impl_data._M_start[uVar48 * 2];
              fVar1 = local_90._M_impl.super__Vector_impl_data._M_start[uVar48 * 2 + 1];
              puVar45 = (undefined4 *)
                        (local_2d8.cstep * uVar48 * local_2d8.elemsize + (long)local_2d8.data);
              lVar37 = uVar48 * 9;
              lVar35 = (long)puVar45 + (long)local_2d8.w;
              lVar22 = (long)local_2d8.w * 2 + (long)puVar45;
              for (iVar30 = 0; iVar30 != iVar46; iVar30 = iVar30 + 1) {
                lVar33 = 0;
                for (iVar42 = iVar27; 0 < iVar42; iVar42 = iVar42 + -1) {
                  fVar55 = (fVar53 * (float)((int)*(char *)((long)pvVar5 + lVar37 + 8) *
                                             (int)*(char *)(lVar22 + 2 + lVar33) +
                                             (int)*(char *)((long)pvVar5 + lVar37 + 7) *
                                             (int)*(char *)(lVar22 + 1 + lVar33) +
                                            (int)*(char *)((long)pvVar5 + lVar37 + 6) *
                                            (int)*(char *)(lVar22 + lVar33) +
                                            (int)*(char *)((long)pvVar5 + lVar37 + 5) *
                                            (int)*(char *)(lVar35 + 2 + lVar33) +
                                            (int)*(char *)((long)pvVar5 + lVar37 + 4) *
                                            (int)*(char *)(lVar35 + 1 + lVar33) +
                                            (int)*(char *)((long)pvVar5 + lVar37 + 3) *
                                            (int)*(char *)(lVar35 + lVar33) +
                                            (int)*(char *)((long)pvVar5 + lVar37 + 2) *
                                            (int)*(char *)((long)puVar45 + lVar33 + 2) +
                                            (int)*(char *)((long)pvVar5 + lVar37 + 1) *
                                            (int)*(char *)((long)puVar45 + lVar33 + 1) +
                                            (int)*(char *)((long)pvVar5 + lVar37) *
                                            (int)*(char *)((long)puVar45 + lVar33)) + fVar54) *
                           fVar1;
                  auVar96 = vandps_avx(ZEXT416((uint)fVar55),auVar56);
                  auVar96 = vorps_avx(auVar96,auVar64);
                  auVar96 = ZEXT416((uint)(fVar55 + auVar96._0_4_));
                  auVar96 = vroundss_avx(auVar96,auVar96,0xb);
                  iVar34 = (int)auVar96._0_4_;
                  if (iVar34 < -0x7e) {
                    iVar34 = -0x7f;
                  }
                  if (0x7e < iVar34) {
                    iVar34 = 0x7f;
                  }
                  *(char *)((long)pvVar51 + lVar33) = (char)iVar34;
                  lVar33 = lVar33 + 1;
                }
                puVar45 = (undefined4 *)((long)puVar45 + lVar33 + 2);
                lVar35 = lVar35 + lVar33 + 2;
                lVar22 = lVar22 + lVar33 + 2;
                pvVar51 = (void *)((long)pvVar51 + lVar33);
              }
            }
            this_00 = &local_90;
          }
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(this_00);
          std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                    ((_Vector_base<float,_std::allocator<float>_> *)&opt_q);
          pLVar8 = this->activation;
          if (pLVar8 != (Layer *)0x0) {
            (*pLVar8->_vptr_Layer[9])(pLVar8,top_blob,opt);
          }
        }
        else if (iVar34 == 8) {
          uVar48 = (long)(this->super_ConvolutionDepthWise).kernel_h *
                   (long)(this->super_ConvolutionDepthWise).kernel_w;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&opt_q,uVar48,
                     (allocator_type *)&top_rescale);
          iVar30 = (this->super_ConvolutionDepthWise).dilation_h;
          iVar42 = (this->super_ConvolutionDepthWise).kernel_w;
          iVar34 = (this->super_ConvolutionDepthWise).dilation_w * iVar42;
          iVar31 = 0;
          lVar35 = 0;
          for (iVar24 = 0; iVar24 < (this->super_ConvolutionDepthWise).kernel_h; iVar24 = iVar24 + 1
              ) {
            for (lVar37 = 0; (int)lVar37 < iVar42; lVar37 = lVar37 + 1) {
              *(int *)(opt_q._0_8_ + (long)(int)lVar35 * 4 + lVar37 * 4) = iVar31;
              iVar31 = iVar31 + (this->super_ConvolutionDepthWise).dilation_w;
              iVar42 = (this->super_ConvolutionDepthWise).kernel_w;
            }
            iVar31 = iVar31 + (iVar49 * iVar30 - iVar34);
            lVar35 = (int)lVar35 + lVar37;
          }
          iVar30 = 0;
          uVar50 = uVar48 & 0xffffffff;
          if ((int)uVar48 < 1) {
            uVar50 = 0;
          }
          if ((int)uVar47 < 1) {
            uVar47 = 0;
          }
          auVar69 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
          auVar145._8_4_ = 0x3f800000;
          auVar145._0_8_ = 0x3f8000003f800000;
          auVar145._12_4_ = 0x3f800000;
          for (uVar36 = 0; uVar36 != uVar47; uVar36 = uVar36 + 1) {
            pauVar38 = (undefined1 (*) [16])
                       (top_blob->elemsize * uVar36 * top_blob->cstep + (long)top_blob->data);
            pvVar4 = (this->weight_data_tm).data;
            pauVar39 = pauVar38;
            for (iVar42 = 0; iVar42 <= iVar46; iVar42 = iVar42 + 1) {
              for (iVar34 = 0; iVar34 <= iVar27; iVar34 = iVar34 + 1) {
                auVar84 = ZEXT1664((undefined1  [16])0x0);
                uVar43 = 0;
                auVar102 = ZEXT1664((undefined1  [16])0x0);
                while( true ) {
                  if (uVar50 == uVar43) break;
                  auVar106._8_8_ = 0;
                  auVar106._0_8_ =
                       *(ulong *)((long)local_2d8.data +
                                 (long)*(int *)(opt_q._0_8_ + uVar43 * 4) * 8 +
                                 (long)iVar42 * (long)(this->super_ConvolutionDepthWise).stride_h *
                                 (long)local_2d8.w * local_2d8.elemsize +
                                 (long)((this->super_ConvolutionDepthWise).stride_w * iVar34 * 8) +
                                 local_2d8.cstep * uVar36 * local_2d8.elemsize);
                  auVar96 = vpcmpgtb_avx((undefined1  [16])0x0,auVar106);
                  auVar122 = vpunpcklbw_avx(auVar106,auVar96);
                  auVar111._8_8_ = 0;
                  auVar111._0_8_ = *(ulong *)((long)pvVar4 + uVar43 * 8 + (long)iVar30);
                  auVar96 = vpcmpgtb_avx((undefined1  [16])0x0,auVar111);
                  auVar96 = vpunpcklbw_avx(auVar111,auVar96);
                  auVar115 = vpmullw_avx(auVar96,auVar122);
                  auVar96 = vpmulhw_avx(auVar122,auVar96);
                  auVar122 = vpunpcklwd_avx(auVar115,auVar96);
                  auVar115 = vpunpckhwd_avx(auVar115,auVar96);
                  auVar96 = vpaddd_avx(auVar102._0_16_,auVar122);
                  auVar102 = ZEXT1664(auVar96);
                  auVar96 = vpaddd_avx(auVar84._0_16_,auVar115);
                  auVar84 = ZEXT1664(auVar96);
                  uVar43 = uVar43 + 1;
                }
                pvVar5 = (this->super_ConvolutionDepthWise).weight_data_int8_scales.data;
                pvVar51 = (this->super_ConvolutionDepthWise).bottom_blob_int8_scales.data;
                auVar96 = *(undefined1 (*) [16])((long)pvVar5 + uVar36 * 0x20);
                auVar115 = *(undefined1 (*) [16])((long)pvVar5 + uVar36 * 0x20 + 0x10);
                pfVar26 = (float *)((long)pvVar51 + uVar36 * 0x20);
                auVar112._0_4_ = auVar96._0_4_ * *pfVar26;
                auVar112._4_4_ = auVar96._4_4_ * pfVar26[1];
                auVar112._8_4_ = auVar96._8_4_ * pfVar26[2];
                auVar112._12_4_ = auVar96._12_4_ * pfVar26[3];
                pfVar26 = (float *)((long)pvVar51 + uVar36 * 0x20 + 0x10);
                auVar134._0_4_ = auVar115._0_4_ * *pfVar26;
                auVar134._4_4_ = auVar115._4_4_ * pfVar26[1];
                auVar134._8_4_ = auVar115._8_4_ * pfVar26[2];
                auVar134._12_4_ = auVar115._12_4_ * pfVar26[3];
                auVar122 = vrcpps_avx(auVar112);
                auVar138 = vrcpps_avx(auVar134);
                auVar96 = vcmpps_avx(auVar96,(undefined1  [16])0x0,4);
                auVar96 = vandps_avx(auVar96,auVar122);
                auVar115 = vcmpps_avx(auVar115,(undefined1  [16])0x0,4);
                auVar115 = vandps_avx(auVar115,auVar138);
                auVar122 = vcvtdq2ps_avx(auVar102._0_16_);
                auVar86._0_4_ = auVar96._0_4_ * auVar122._0_4_;
                auVar86._4_4_ = auVar96._4_4_ * auVar122._4_4_;
                auVar86._8_4_ = auVar96._8_4_ * auVar122._8_4_;
                auVar86._12_4_ = auVar96._12_4_ * auVar122._12_4_;
                auVar96 = vcvtdq2ps_avx(auVar84._0_16_);
                auVar107._0_4_ = auVar115._0_4_ * auVar96._0_4_;
                auVar107._4_4_ = auVar115._4_4_ * auVar96._4_4_;
                auVar107._8_4_ = auVar115._8_4_ * auVar96._8_4_;
                auVar107._12_4_ = auVar115._12_4_ * auVar96._12_4_;
                if ((this->super_ConvolutionDepthWise).bias_term != 0) {
                  pvVar5 = (this->super_ConvolutionDepthWise).bias_data.data;
                  pfVar26 = (float *)((long)pvVar5 + uVar36 * 0x20);
                  auVar86._0_4_ = auVar86._0_4_ + *pfVar26;
                  auVar86._4_4_ = auVar86._4_4_ + pfVar26[1];
                  auVar86._8_4_ = auVar86._8_4_ + pfVar26[2];
                  auVar86._12_4_ = auVar86._12_4_ + pfVar26[3];
                  pfVar26 = (float *)((long)pvVar5 + uVar36 * 0x20 + 0x10);
                  auVar107._0_4_ = auVar107._0_4_ + *pfVar26;
                  auVar107._4_4_ = auVar107._4_4_ + pfVar26[1];
                  auVar107._8_4_ = auVar107._8_4_ + pfVar26[2];
                  auVar107._12_4_ = auVar107._12_4_ + pfVar26[3];
                }
                iVar24 = (this->super_ConvolutionDepthWise).activation_type;
                auVar154 = auVar86;
                auVar81 = auVar107;
                if (5 < iVar24 - 1U) goto switchD_003b6707_caseD_1;
                auVar154 = vmaxps_avx(auVar86,(undefined1  [16])0x0);
                auVar81 = vmaxps_avx(auVar107,(undefined1  [16])0x0);
                auVar96 = auVar69._0_16_;
                fVar54 = auVar69._0_4_;
                fVar53 = auVar69._4_4_;
                fVar1 = auVar69._8_4_;
                fVar55 = auVar69._12_4_;
                fVar85 = auVar86._0_4_;
                fVar103 = auVar86._4_4_;
                fVar104 = auVar86._8_4_;
                fVar105 = auVar86._12_4_;
                fVar9 = auVar107._8_4_;
                fVar10 = auVar107._12_4_;
                switch(iVar24) {
                case 2:
                  auVar96 = vminps_avx(auVar86,(undefined1  [16])0x0);
                  fVar54 = *(this->super_ConvolutionDepthWise).activation_params.data;
                  auVar153._0_4_ = auVar154._0_4_ + fVar54 * auVar96._0_4_;
                  auVar153._4_4_ = auVar154._4_4_ + fVar54 * auVar96._4_4_;
                  auVar153._8_4_ = auVar154._8_4_ + fVar54 * auVar96._8_4_;
                  auVar153._12_4_ = auVar154._12_4_ + fVar54 * auVar96._12_4_;
                  auVar96 = vminps_avx(auVar107,(undefined1  [16])0x0);
                  auVar70._0_4_ = fVar54 * auVar96._0_4_ + auVar81._0_4_;
                  auVar70._4_4_ = fVar54 * auVar96._4_4_ + auVar81._4_4_;
                  auVar70._8_4_ = fVar54 * auVar96._8_4_ + auVar81._8_4_;
                  auVar70._12_4_ = fVar54 * auVar96._12_4_ + auVar81._12_4_;
                  auVar154 = auVar153;
                  auVar81 = auVar70;
                  break;
                case 3:
                  puVar45 = (undefined4 *)(this->super_ConvolutionDepthWise).activation_params.data;
                  uVar32 = *puVar45;
                  auVar76._4_4_ = uVar32;
                  auVar76._0_4_ = uVar32;
                  auVar76._8_4_ = uVar32;
                  auVar76._12_4_ = uVar32;
                  uVar32 = puVar45[1];
                  auVar126._4_4_ = uVar32;
                  auVar126._0_4_ = uVar32;
                  auVar126._8_4_ = uVar32;
                  auVar126._12_4_ = uVar32;
                  auVar96 = vmaxps_avx(auVar86,auVar76);
                  auVar154 = vminps_avx(auVar96,auVar126);
                  auVar96 = vmaxps_avx(auVar107,auVar76);
                  auVar81 = vminps_avx(auVar96,auVar126);
                  break;
                case 4:
                  auVar77._0_8_ = auVar86._0_8_ ^ 0x8000000080000000;
                  auVar77._8_4_ = -fVar104;
                  auVar77._12_4_ = -fVar105;
                  auVar151._8_4_ = 0x42b0c0a5;
                  auVar151._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar151._12_4_ = 0x42b0c0a5;
                  auVar115 = vminps_avx(auVar151,auVar77);
                  auVar152._8_4_ = 0xc2b0c0a5;
                  auVar152._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar152._12_4_ = 0xc2b0c0a5;
                  auVar138 = vmaxps_avx(auVar152,auVar115);
                  auVar97._0_4_ = auVar138._0_4_ * 1.442695 + fVar54;
                  auVar97._4_4_ = auVar138._4_4_ * 1.442695 + fVar53;
                  auVar97._8_4_ = auVar138._8_4_ * 1.442695 + fVar1;
                  auVar97._12_4_ = auVar138._12_4_ * 1.442695 + fVar55;
                  auVar127._0_4_ = (int)auVar97._0_4_;
                  auVar127._4_4_ = (int)auVar97._4_4_;
                  auVar127._8_4_ = (int)auVar97._8_4_;
                  auVar127._12_4_ = (int)auVar97._12_4_;
                  auVar122 = vcvtdq2ps_avx(auVar127);
                  auVar115 = vcmpps_avx(auVar97,auVar122,1);
                  auVar115 = vandps_avx(auVar145,auVar115);
                  auVar115 = vsubps_avx(auVar122,auVar115);
                  auVar128._0_4_ = auVar115._0_4_ * 0.6931472;
                  auVar128._4_4_ = auVar115._4_4_ * 0.6931472;
                  auVar128._8_4_ = auVar115._8_4_ * 0.6931472;
                  auVar128._12_4_ = auVar115._12_4_ * 0.6931472;
                  auVar122 = vsubps_avx(auVar138,auVar128);
                  fVar85 = auVar122._0_4_;
                  fVar104 = auVar122._4_4_;
                  fVar110 = auVar122._8_4_;
                  fVar131 = auVar122._12_4_;
                  auVar98._0_4_ = (int)auVar115._0_4_;
                  auVar98._4_4_ = (int)auVar115._4_4_;
                  auVar98._8_4_ = (int)auVar115._8_4_;
                  auVar98._12_4_ = (int)auVar115._12_4_;
                  auVar115 = vpslld_avx(auVar98,0x17);
                  auVar66 = vpaddd_avx(auVar145,auVar115);
                  auVar99._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
                  auVar99._8_4_ = -fVar9;
                  auVar99._12_4_ = -fVar10;
                  auVar115 = vminps_avx(auVar151,auVar99);
                  auVar138 = vmaxps_avx(auVar152,auVar115);
                  auVar108._0_4_ = auVar138._0_4_ * 1.442695 + fVar54;
                  auVar108._4_4_ = auVar138._4_4_ * 1.442695 + fVar53;
                  auVar108._8_4_ = auVar138._8_4_ * 1.442695 + fVar1;
                  auVar108._12_4_ = auVar138._12_4_ * 1.442695 + fVar55;
                  auVar129._0_4_ = (int)auVar108._0_4_;
                  auVar129._4_4_ = (int)auVar108._4_4_;
                  auVar129._8_4_ = (int)auVar108._8_4_;
                  auVar129._12_4_ = (int)auVar108._12_4_;
                  auVar122 = vcvtdq2ps_avx(auVar129);
                  auVar115 = vcmpps_avx(auVar108,auVar122,1);
                  auVar115 = vandps_avx(auVar145,auVar115);
                  auVar115 = vsubps_avx(auVar122,auVar115);
                  auVar130._0_4_ = auVar115._0_4_ * 0.6931472;
                  auVar130._4_4_ = auVar115._4_4_ * 0.6931472;
                  auVar130._8_4_ = auVar115._8_4_ * 0.6931472;
                  auVar130._12_4_ = auVar115._12_4_ * 0.6931472;
                  auVar122 = vsubps_avx(auVar138,auVar130);
                  fVar103 = auVar122._0_4_;
                  fVar105 = auVar122._4_4_;
                  fVar9 = auVar122._8_4_;
                  fVar10 = auVar122._12_4_;
                  auVar69 = ZEXT1664(auVar96);
                  auVar109._0_4_ = (int)auVar115._0_4_;
                  auVar109._4_4_ = (int)auVar115._4_4_;
                  auVar109._8_4_ = (int)auVar115._8_4_;
                  auVar109._12_4_ = (int)auVar115._12_4_;
                  auVar96 = vpslld_avx(auVar109,0x17);
                  auVar96 = vpaddd_avx(auVar145,auVar96);
                  auVar78._0_4_ =
                       (fVar85 + 1.0 +
                       fVar85 * fVar85 *
                       (((((fVar85 * 0.00019875691 + 0.0013981999) * fVar85 + 0.008333452) * fVar85
                         + 0.041665796) * fVar85 + 0.16666666) * fVar85 + fVar54)) * auVar66._0_4_ +
                       1.0;
                  auVar78._4_4_ =
                       (fVar104 + 1.0 +
                       fVar104 * fVar104 *
                       (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) *
                          fVar104 + 0.041665796) * fVar104 + 0.16666666) * fVar104 + fVar53)) *
                       auVar66._4_4_ + 1.0;
                  auVar78._8_4_ =
                       (fVar110 + 1.0 +
                       fVar110 * fVar110 *
                       (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) *
                          fVar110 + 0.041665796) * fVar110 + 0.16666666) * fVar110 + fVar1)) *
                       auVar66._8_4_ + 1.0;
                  auVar78._12_4_ =
                       (fVar131 + 1.0 +
                       fVar131 * fVar131 *
                       (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) *
                          fVar131 + 0.041665796) * fVar131 + 0.16666666) * fVar131 + fVar55)) *
                       auVar66._12_4_ + 1.0;
                  auVar154 = vdivps_avx(auVar145,auVar78);
                  auVar79._0_4_ =
                       (fVar103 + 1.0 +
                       fVar103 * fVar103 *
                       (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                          fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar54)) *
                       auVar96._0_4_ + 1.0;
                  auVar79._4_4_ =
                       (fVar105 + 1.0 +
                       fVar105 * fVar105 *
                       (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                          fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + fVar53)) *
                       auVar96._4_4_ + 1.0;
                  auVar79._8_4_ =
                       (fVar9 + 1.0 +
                       fVar9 * fVar9 *
                       (((((fVar9 * 0.00019875691 + 0.0013981999) * fVar9 + 0.008333452) * fVar9 +
                         0.041665796) * fVar9 + 0.16666666) * fVar9 + fVar1)) * auVar96._8_4_ + 1.0;
                  auVar79._12_4_ =
                       (fVar10 + 1.0 +
                       fVar10 * fVar10 *
                       (((((fVar10 * 0.00019875691 + 0.0013981999) * fVar10 + 0.008333452) * fVar10
                         + 0.041665796) * fVar10 + 0.16666666) * fVar10 + fVar55)) * auVar96._12_4_
                       + 1.0;
                  auVar81 = vdivps_avx(auVar145,auVar79);
                  break;
                case 5:
                  auVar58._8_4_ = 0x42b0c0a5;
                  auVar58._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar58._12_4_ = 0x42b0c0a5;
                  auVar115 = vminps_avx(auVar86,auVar58);
                  auVar59._8_4_ = 0xc2b0c0a5;
                  auVar59._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar59._12_4_ = 0xc2b0c0a5;
                  auVar138 = vmaxps_avx(auVar115,auVar59);
                  auVar113._0_4_ = auVar138._0_4_ * 1.442695 + fVar54;
                  auVar113._4_4_ = auVar138._4_4_ * 1.442695 + fVar53;
                  auVar113._8_4_ = auVar138._8_4_ * 1.442695 + fVar1;
                  auVar113._12_4_ = auVar138._12_4_ * 1.442695 + fVar55;
                  auVar135._0_4_ = (int)auVar113._0_4_;
                  auVar135._4_4_ = (int)auVar113._4_4_;
                  auVar135._8_4_ = (int)auVar113._8_4_;
                  auVar135._12_4_ = (int)auVar113._12_4_;
                  auVar122 = vcvtdq2ps_avx(auVar135);
                  auVar115 = vcmpps_avx(auVar113,auVar122,1);
                  auVar115 = vandps_avx(auVar145,auVar115);
                  auVar115 = vsubps_avx(auVar122,auVar115);
                  auVar136._0_4_ = auVar115._0_4_ * 0.6931472;
                  auVar136._4_4_ = auVar115._4_4_ * 0.6931472;
                  auVar136._8_4_ = auVar115._8_4_ * 0.6931472;
                  auVar136._12_4_ = auVar115._12_4_ * 0.6931472;
                  auVar122 = vsubps_avx(auVar138,auVar136);
                  fVar110 = auVar122._0_4_;
                  fVar131 = auVar122._4_4_;
                  fVar132 = auVar122._8_4_;
                  fVar133 = auVar122._12_4_;
                  auVar114._0_4_ = (int)auVar115._0_4_;
                  auVar114._4_4_ = (int)auVar115._4_4_;
                  auVar114._8_4_ = (int)auVar115._8_4_;
                  auVar114._12_4_ = (int)auVar115._12_4_;
                  auVar115 = vpslld_avx(auVar114,0x17);
                  auVar115 = vpaddd_avx(auVar145,auVar115);
                  auVar116._0_4_ =
                       (fVar110 + 1.0 +
                       (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) *
                          fVar110 + 0.041665796) * fVar110 + 0.16666666) * fVar110 + fVar54) *
                       fVar110 * fVar110) * auVar115._0_4_ + 1.0;
                  auVar116._4_4_ =
                       (fVar131 + 1.0 +
                       (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) *
                          fVar131 + 0.041665796) * fVar131 + 0.16666666) * fVar131 + fVar53) *
                       fVar131 * fVar131) * auVar115._4_4_ + 1.0;
                  auVar116._8_4_ =
                       (fVar132 + 1.0 +
                       (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) *
                          fVar132 + 0.041665796) * fVar132 + 0.16666666) * fVar132 + fVar1) *
                       fVar132 * fVar132) * auVar115._8_4_ + 1.0;
                  auVar116._12_4_ =
                       (fVar133 + 1.0 +
                       (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) *
                          fVar133 + 0.041665796) * fVar133 + 0.16666666) * fVar133 + fVar55) *
                       fVar133 * fVar133) * auVar115._12_4_ + 1.0;
                  auVar122 = vcmpps_avx(auVar116,(undefined1  [16])0x0,2);
                  auVar137._8_4_ = 0x800000;
                  auVar137._0_8_ = 0x80000000800000;
                  auVar137._12_4_ = 0x800000;
                  auVar115 = vmaxps_avx(auVar116,auVar137);
                  auVar138 = vpsrld_avx(auVar115,0x17);
                  auVar146._8_4_ = 0x807fffff;
                  auVar146._0_8_ = 0x807fffff807fffff;
                  auVar146._12_4_ = 0x807fffff;
                  auVar115 = vandps_avx(auVar146,auVar115);
                  auVar67 = vorps_avx(auVar115,auVar96);
                  auVar147._8_4_ = 0xffffff82;
                  auVar147._0_8_ = 0xffffff82ffffff82;
                  auVar147._12_4_ = 0xffffff82;
                  auVar115 = vpaddd_avx(auVar147,auVar138);
                  auVar66 = vcvtdq2ps_avx(auVar115);
                  auVar148._8_4_ = 0x3f3504f3;
                  auVar148._0_8_ = 0x3f3504f33f3504f3;
                  auVar148._12_4_ = 0x3f3504f3;
                  auVar138 = vcmpps_avx(auVar67,auVar148,1);
                  auVar115 = vandps_avx(auVar138,auVar67);
                  fVar110 = auVar115._0_4_ + auVar67._0_4_ + -1.0;
                  fVar131 = auVar115._4_4_ + auVar67._4_4_ + -1.0;
                  fVar132 = auVar115._8_4_ + auVar67._8_4_ + -1.0;
                  fVar133 = auVar115._12_4_ + auVar67._12_4_ + -1.0;
                  auVar115 = vandps_avx(auVar138,auVar145);
                  auVar115 = vsubps_avx(auVar66,auVar115);
                  auVar117._0_4_ =
                       (fVar110 * fVar110 *
                        (((((((((fVar110 * 0.070376836 + -0.1151461) * fVar110 + 0.116769984) *
                               fVar110 + -0.12420141) * fVar110 + 0.14249323) * fVar110 +
                            -0.16668057) * fVar110 + 0.20000714) * fVar110 + -0.24999994) * fVar110
                         + 0.3333333) * fVar110 + -0.5) + auVar115._0_4_ * 0.6931472 + fVar110) *
                       -2.0;
                  auVar117._4_4_ =
                       (fVar131 * fVar131 *
                        (((((((((fVar131 * 0.070376836 + -0.1151461) * fVar131 + 0.116769984) *
                               fVar131 + -0.12420141) * fVar131 + 0.14249323) * fVar131 +
                            -0.16668057) * fVar131 + 0.20000714) * fVar131 + -0.24999994) * fVar131
                         + 0.3333333) * fVar131 + -0.5) + auVar115._4_4_ * 0.6931472 + fVar131) *
                       -2.0;
                  auVar117._8_4_ =
                       (fVar132 * fVar132 *
                        (((((((((fVar132 * 0.070376836 + -0.1151461) * fVar132 + 0.116769984) *
                               fVar132 + -0.12420141) * fVar132 + 0.14249323) * fVar132 +
                            -0.16668057) * fVar132 + 0.20000714) * fVar132 + -0.24999994) * fVar132
                         + 0.3333333) * fVar132 + -0.5) + auVar115._8_4_ * 0.6931472 + fVar132) *
                       -2.0;
                  auVar117._12_4_ =
                       (fVar133 * fVar133 *
                        (((((((((fVar133 * 0.070376836 + -0.1151461) * fVar133 + 0.116769984) *
                               fVar133 + -0.12420141) * fVar133 + 0.14249323) * fVar133 +
                            -0.16668057) * fVar133 + 0.20000714) * fVar133 + -0.24999994) * fVar133
                         + 0.3333333) * fVar133 + -0.5) + auVar115._12_4_ * 0.6931472 + fVar133) *
                       -2.0;
                  auVar149._8_4_ = 0x7fffffff;
                  auVar149._0_8_ = 0x7fffffff7fffffff;
                  auVar149._12_4_ = 0x7fffffff;
                  auVar115 = vblendvps_avx(auVar117,auVar149,auVar122);
                  auVar60._8_4_ = 0x42b0c0a5;
                  auVar60._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar60._12_4_ = 0x42b0c0a5;
                  auVar115 = vminps_avx(auVar115,auVar60);
                  auVar61._8_4_ = 0xc2b0c0a5;
                  auVar61._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar61._12_4_ = 0xc2b0c0a5;
                  auVar138 = vmaxps_avx(auVar115,auVar61);
                  auVar118._0_4_ = auVar138._0_4_ * 1.442695 + fVar54;
                  auVar118._4_4_ = auVar138._4_4_ * 1.442695 + fVar53;
                  auVar118._8_4_ = auVar138._8_4_ * 1.442695 + fVar1;
                  auVar118._12_4_ = auVar138._12_4_ * 1.442695 + fVar55;
                  auVar139._0_4_ = (int)auVar118._0_4_;
                  auVar139._4_4_ = (int)auVar118._4_4_;
                  auVar139._8_4_ = (int)auVar118._8_4_;
                  auVar139._12_4_ = (int)auVar118._12_4_;
                  auVar122 = vcvtdq2ps_avx(auVar139);
                  auVar115 = vcmpps_avx(auVar118,auVar122,1);
                  auVar115 = vandps_avx(auVar145,auVar115);
                  auVar115 = vsubps_avx(auVar122,auVar115);
                  auVar140._0_4_ = auVar115._0_4_ * 0.6931472;
                  auVar140._4_4_ = auVar115._4_4_ * 0.6931472;
                  auVar140._8_4_ = auVar115._8_4_ * 0.6931472;
                  auVar140._12_4_ = auVar115._12_4_ * 0.6931472;
                  auVar122 = vsubps_avx(auVar138,auVar140);
                  fVar110 = auVar122._0_4_;
                  fVar131 = auVar122._4_4_;
                  fVar132 = auVar122._8_4_;
                  fVar133 = auVar122._12_4_;
                  auVar119._0_4_ = (int)auVar115._0_4_;
                  auVar119._4_4_ = (int)auVar115._4_4_;
                  auVar119._8_4_ = (int)auVar115._8_4_;
                  auVar119._12_4_ = (int)auVar115._12_4_;
                  auVar115 = vpslld_avx(auVar119,0x17);
                  auVar115 = vpaddd_avx(auVar145,auVar115);
                  auVar71._0_4_ =
                       (fVar110 + 1.0 +
                       (((((fVar110 * 0.00019875691 + 0.0013981999) * fVar110 + 0.008333452) *
                          fVar110 + 0.041665796) * fVar110 + 0.16666666) * fVar110 + fVar54) *
                       fVar110 * fVar110) * auVar115._0_4_ + 1.0;
                  auVar71._4_4_ =
                       (fVar131 + 1.0 +
                       (((((fVar131 * 0.00019875691 + 0.0013981999) * fVar131 + 0.008333452) *
                          fVar131 + 0.041665796) * fVar131 + 0.16666666) * fVar131 + fVar53) *
                       fVar131 * fVar131) * auVar115._4_4_ + 1.0;
                  auVar71._8_4_ =
                       (fVar132 + 1.0 +
                       (((((fVar132 * 0.00019875691 + 0.0013981999) * fVar132 + 0.008333452) *
                          fVar132 + 0.041665796) * fVar132 + 0.16666666) * fVar132 + fVar1) *
                       fVar132 * fVar132) * auVar115._8_4_ + 1.0;
                  auVar71._12_4_ =
                       (fVar133 + 1.0 +
                       (((((fVar133 * 0.00019875691 + 0.0013981999) * fVar133 + 0.008333452) *
                          fVar133 + 0.041665796) * fVar133 + 0.16666666) * fVar133 + fVar55) *
                       fVar133 * fVar133) * auVar115._12_4_ + 1.0;
                  auVar150._8_4_ = 0x40000000;
                  auVar150._0_8_ = 0x4000000040000000;
                  auVar150._12_4_ = 0x40000000;
                  auVar115 = vdivps_avx(auVar150,auVar71);
                  auVar154._0_4_ = (auVar115._0_4_ + -1.0) * fVar85;
                  auVar154._4_4_ = (auVar115._4_4_ + -1.0) * fVar103;
                  auVar154._8_4_ = (auVar115._8_4_ + -1.0) * fVar104;
                  auVar154._12_4_ = (auVar115._12_4_ + -1.0) * fVar105;
                  auVar72._8_4_ = 0x42b0c0a5;
                  auVar72._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar72._12_4_ = 0x42b0c0a5;
                  auVar115 = vminps_avx(auVar107,auVar72);
                  auVar87._8_4_ = 0xc2b0c0a5;
                  auVar87._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar87._12_4_ = 0xc2b0c0a5;
                  auVar138 = vmaxps_avx(auVar115,auVar87);
                  auVar88._0_4_ = auVar138._0_4_ * 1.442695 + fVar54;
                  auVar88._4_4_ = auVar138._4_4_ * 1.442695 + fVar53;
                  auVar88._8_4_ = auVar138._8_4_ * 1.442695 + fVar1;
                  auVar88._12_4_ = auVar138._12_4_ * 1.442695 + fVar55;
                  auVar120._0_4_ = (int)auVar88._0_4_;
                  auVar120._4_4_ = (int)auVar88._4_4_;
                  auVar120._8_4_ = (int)auVar88._8_4_;
                  auVar120._12_4_ = (int)auVar88._12_4_;
                  auVar122 = vcvtdq2ps_avx(auVar120);
                  auVar115 = vcmpps_avx(auVar88,auVar122,1);
                  auVar115 = vandps_avx(auVar145,auVar115);
                  auVar115 = vsubps_avx(auVar122,auVar115);
                  auVar121._0_4_ = auVar115._0_4_ * 0.6931472;
                  auVar121._4_4_ = auVar115._4_4_ * 0.6931472;
                  auVar121._8_4_ = auVar115._8_4_ * 0.6931472;
                  auVar121._12_4_ = auVar115._12_4_ * 0.6931472;
                  auVar122 = vsubps_avx(auVar138,auVar121);
                  fVar85 = auVar122._0_4_;
                  fVar103 = auVar122._4_4_;
                  fVar104 = auVar122._8_4_;
                  fVar105 = auVar122._12_4_;
                  auVar89._0_4_ = (int)auVar115._0_4_;
                  auVar89._4_4_ = (int)auVar115._4_4_;
                  auVar89._8_4_ = (int)auVar115._8_4_;
                  auVar89._12_4_ = (int)auVar115._12_4_;
                  auVar115 = vpslld_avx(auVar89,0x17);
                  auVar115 = vpaddd_avx(auVar145,auVar115);
                  auVar73._0_4_ =
                       (fVar85 + 1.0 +
                       fVar85 * fVar85 *
                       (((((fVar85 * 0.00019875691 + 0.0013981999) * fVar85 + 0.008333452) * fVar85
                         + 0.041665796) * fVar85 + 0.16666666) * fVar85 + fVar54)) * auVar115._0_4_
                       + 1.0;
                  auVar73._4_4_ =
                       (fVar103 + 1.0 +
                       fVar103 * fVar103 *
                       (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                          fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar53)) *
                       auVar115._4_4_ + 1.0;
                  auVar73._8_4_ =
                       (fVar104 + 1.0 +
                       fVar104 * fVar104 *
                       (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) *
                          fVar104 + 0.041665796) * fVar104 + 0.16666666) * fVar104 + fVar1)) *
                       auVar115._8_4_ + 1.0;
                  auVar73._12_4_ =
                       (fVar105 + 1.0 +
                       fVar105 * fVar105 *
                       (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                          fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + fVar55)) *
                       auVar115._12_4_ + 1.0;
                  auVar90._8_4_ = 0x800000;
                  auVar90._0_8_ = 0x80000000800000;
                  auVar90._12_4_ = 0x800000;
                  auVar115 = vmaxps_avx(auVar73,auVar90);
                  auVar122 = vpsrld_avx(auVar115,0x17);
                  auVar141._8_4_ = 0x807fffff;
                  auVar141._0_8_ = 0x807fffff807fffff;
                  auVar141._12_4_ = 0x807fffff;
                  auVar115 = vandps_avx(auVar115,auVar141);
                  auVar138 = vorps_avx(auVar115,auVar96);
                  auVar142._8_4_ = 0xffffff82;
                  auVar142._0_8_ = 0xffffff82ffffff82;
                  auVar142._12_4_ = 0xffffff82;
                  auVar96 = vpaddd_avx(auVar122,auVar142);
                  auVar122 = vcvtdq2ps_avx(auVar96);
                  auVar143._8_4_ = 0x3f3504f3;
                  auVar143._0_8_ = 0x3f3504f33f3504f3;
                  auVar143._12_4_ = 0x3f3504f3;
                  auVar115 = vcmpps_avx(auVar138,auVar143,1);
                  auVar96 = vandps_avx(auVar115,auVar138);
                  fVar85 = auVar96._0_4_ + auVar138._0_4_ + -1.0;
                  fVar103 = auVar96._4_4_ + auVar138._4_4_ + -1.0;
                  fVar104 = auVar96._8_4_ + auVar138._8_4_ + -1.0;
                  fVar105 = auVar96._12_4_ + auVar138._12_4_ + -1.0;
                  auVar96 = vandps_avx(auVar145,auVar115);
                  auVar115 = vsubps_avx(auVar122,auVar96);
                  auVar96 = vcmpps_avx(auVar73,(undefined1  [16])0x0,2);
                  auVar91._0_4_ =
                       (auVar115._0_4_ * 0.6931472 + fVar85 +
                       (((((((((fVar85 * 0.070376836 + -0.1151461) * fVar85 + 0.116769984) * fVar85
                             + -0.12420141) * fVar85 + 0.14249323) * fVar85 + -0.16668057) * fVar85
                          + 0.20000714) * fVar85 + -0.24999994) * fVar85 + 0.3333333) * fVar85 +
                       -0.5) * fVar85 * fVar85) * -2.0;
                  auVar91._4_4_ =
                       (auVar115._4_4_ * 0.6931472 + fVar103 +
                       (((((((((fVar103 * 0.070376836 + -0.1151461) * fVar103 + 0.116769984) *
                              fVar103 + -0.12420141) * fVar103 + 0.14249323) * fVar103 + -0.16668057
                           ) * fVar103 + 0.20000714) * fVar103 + -0.24999994) * fVar103 + 0.3333333)
                        * fVar103 + -0.5) * fVar103 * fVar103) * -2.0;
                  auVar91._8_4_ =
                       (auVar115._8_4_ * 0.6931472 + fVar104 +
                       (((((((((fVar104 * 0.070376836 + -0.1151461) * fVar104 + 0.116769984) *
                              fVar104 + -0.12420141) * fVar104 + 0.14249323) * fVar104 + -0.16668057
                           ) * fVar104 + 0.20000714) * fVar104 + -0.24999994) * fVar104 + 0.3333333)
                        * fVar104 + -0.5) * fVar104 * fVar104) * -2.0;
                  auVar91._12_4_ =
                       (auVar115._12_4_ * 0.6931472 + fVar105 +
                       (((((((((fVar105 * 0.070376836 + -0.1151461) * fVar105 + 0.116769984) *
                              fVar105 + -0.12420141) * fVar105 + 0.14249323) * fVar105 + -0.16668057
                           ) * fVar105 + 0.20000714) * fVar105 + -0.24999994) * fVar105 + 0.3333333)
                        * fVar105 + -0.5) * fVar105 * fVar105) * -2.0;
                  auVar123._8_4_ = 0x7fffffff;
                  auVar123._0_8_ = 0x7fffffff7fffffff;
                  auVar123._12_4_ = 0x7fffffff;
                  auVar96 = vblendvps_avx(auVar91,auVar123,auVar96);
                  auVar92._8_4_ = 0x42b0c0a5;
                  auVar92._0_8_ = 0x42b0c0a542b0c0a5;
                  auVar92._12_4_ = 0x42b0c0a5;
                  auVar96 = vminps_avx(auVar96,auVar92);
                  auVar93._8_4_ = 0xc2b0c0a5;
                  auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
                  auVar93._12_4_ = 0xc2b0c0a5;
                  auVar122 = vmaxps_avx(auVar96,auVar93);
                  auVar94._0_4_ = auVar122._0_4_ * 1.442695 + fVar54;
                  auVar94._4_4_ = auVar122._4_4_ * 1.442695 + fVar53;
                  auVar94._8_4_ = auVar122._8_4_ * 1.442695 + fVar1;
                  auVar94._12_4_ = auVar122._12_4_ * 1.442695 + fVar55;
                  auVar124._0_4_ = (int)auVar94._0_4_;
                  auVar124._4_4_ = (int)auVar94._4_4_;
                  auVar124._8_4_ = (int)auVar94._8_4_;
                  auVar124._12_4_ = (int)auVar94._12_4_;
                  auVar115 = vcvtdq2ps_avx(auVar124);
                  auVar96 = vcmpps_avx(auVar94,auVar115,1);
                  auVar96 = vandps_avx(auVar145,auVar96);
                  auVar96 = vsubps_avx(auVar115,auVar96);
                  auVar125._0_4_ = auVar96._0_4_ * 0.6931472;
                  auVar125._4_4_ = auVar96._4_4_ * 0.6931472;
                  auVar125._8_4_ = auVar96._8_4_ * 0.6931472;
                  auVar125._12_4_ = auVar96._12_4_ * 0.6931472;
                  auVar115 = vsubps_avx(auVar122,auVar125);
                  fVar85 = auVar115._0_4_;
                  fVar103 = auVar115._4_4_;
                  fVar104 = auVar115._8_4_;
                  fVar105 = auVar115._12_4_;
                  auVar95._0_4_ = (int)auVar96._0_4_;
                  auVar95._4_4_ = (int)auVar96._4_4_;
                  auVar95._8_4_ = (int)auVar96._8_4_;
                  auVar95._12_4_ = (int)auVar96._12_4_;
                  auVar96 = vpslld_avx(auVar95,0x17);
                  auVar96 = vpaddd_avx(auVar145,auVar96);
                  auVar74._0_4_ =
                       (fVar85 + 1.0 +
                       fVar85 * fVar85 *
                       (((((fVar85 * 0.00019875691 + 0.0013981999) * fVar85 + 0.008333452) * fVar85
                         + 0.041665796) * fVar85 + 0.16666666) * fVar85 + fVar54)) * auVar96._0_4_ +
                       1.0;
                  auVar74._4_4_ =
                       (fVar103 + 1.0 +
                       fVar103 * fVar103 *
                       (((((fVar103 * 0.00019875691 + 0.0013981999) * fVar103 + 0.008333452) *
                          fVar103 + 0.041665796) * fVar103 + 0.16666666) * fVar103 + fVar53)) *
                       auVar96._4_4_ + 1.0;
                  auVar74._8_4_ =
                       (fVar104 + 1.0 +
                       fVar104 * fVar104 *
                       (((((fVar104 * 0.00019875691 + 0.0013981999) * fVar104 + 0.008333452) *
                          fVar104 + 0.041665796) * fVar104 + 0.16666666) * fVar104 + fVar1)) *
                       auVar96._8_4_ + 1.0;
                  auVar74._12_4_ =
                       (fVar105 + 1.0 +
                       fVar105 * fVar105 *
                       (((((fVar105 * 0.00019875691 + 0.0013981999) * fVar105 + 0.008333452) *
                          fVar105 + 0.041665796) * fVar105 + 0.16666666) * fVar105 + fVar55)) *
                       auVar96._12_4_ + 1.0;
                  auVar62._8_4_ = 0x40000000;
                  auVar62._0_8_ = 0x4000000040000000;
                  auVar62._12_4_ = 0x40000000;
                  auVar96 = vdivps_avx(auVar62,auVar74);
                  auVar75._0_4_ = auVar96._0_4_ + -1.0;
                  auVar75._4_4_ = auVar96._4_4_ + -1.0;
                  auVar75._8_4_ = auVar96._8_4_ + -1.0;
                  auVar75._12_4_ = auVar96._12_4_ + -1.0;
                  goto LAB_003b6eba;
                case 6:
                  pfVar26 = (float *)(this->super_ConvolutionDepthWise).activation_params.data;
                  fVar54 = *pfVar26;
                  fVar53 = pfVar26[1];
                  auVar144._0_4_ = fVar54 * fVar85 + fVar53;
                  auVar144._4_4_ = fVar54 * fVar103 + fVar53;
                  auVar144._8_4_ = fVar54 * fVar104 + fVar53;
                  auVar144._12_4_ = fVar54 * fVar105 + fVar53;
                  auVar96 = vmaxps_avx(auVar144,(undefined1  [16])0x0);
                  auVar96 = vminps_avx(auVar145,auVar96);
                  auVar154._0_4_ = auVar96._0_4_ * fVar85;
                  auVar154._4_4_ = auVar96._4_4_ * fVar103;
                  auVar154._8_4_ = auVar96._8_4_ * fVar104;
                  auVar154._12_4_ = auVar96._12_4_ * fVar105;
                  auVar80._0_4_ = fVar54 * auVar107._0_4_ + fVar53;
                  auVar80._4_4_ = fVar54 * auVar107._4_4_ + fVar53;
                  auVar80._8_4_ = fVar54 * fVar9 + fVar53;
                  auVar80._12_4_ = fVar54 * fVar10 + fVar53;
                  auVar96 = vmaxps_avx(auVar80,(undefined1  [16])0x0);
                  auVar75 = vminps_avx(auVar145,auVar96);
LAB_003b6eba:
                  auVar81._0_4_ = auVar75._0_4_ * auVar107._0_4_;
                  auVar81._4_4_ = auVar75._4_4_ * auVar107._4_4_;
                  auVar81._8_4_ = auVar75._8_4_ * fVar9;
                  auVar81._12_4_ = auVar75._12_4_ * fVar10;
                }
switchD_003b6707_caseD_1:
                if (iVar2 < 0x65) {
                  *pauVar39 = auVar154;
                  pauVar39[1] = auVar81;
                  pauVar39 = pauVar39 + 2;
                }
                else {
                  pvVar5 = (this->super_ConvolutionDepthWise).top_blob_int8_scales.data;
                  pfVar26 = (float *)((long)pvVar5 + uVar36 * 0x20);
                  auVar100._0_4_ = auVar154._0_4_ * *pfVar26;
                  auVar100._4_4_ = auVar154._4_4_ * pfVar26[1];
                  auVar100._8_4_ = auVar154._8_4_ * pfVar26[2];
                  auVar100._12_4_ = auVar154._12_4_ * pfVar26[3];
                  pfVar26 = (float *)((long)pvVar5 + uVar36 * 0x20 + 0x10);
                  auVar82._0_4_ = auVar81._0_4_ * *pfVar26;
                  auVar82._4_4_ = auVar81._4_4_ * pfVar26[1];
                  auVar82._8_4_ = auVar81._8_4_ * pfVar26[2];
                  auVar82._12_4_ = auVar81._12_4_ * pfVar26[3];
                  auVar63._8_4_ = 0x80000000;
                  auVar63._0_8_ = 0x8000000080000000;
                  auVar63._12_4_ = 0x80000000;
                  auVar96 = vandps_avx(auVar100,auVar63);
                  auVar115 = vandps_avx(auVar82,auVar63);
                  auVar96 = vorps_avx(auVar96,auVar69._0_16_);
                  auVar115 = vorps_avx(auVar115,auVar69._0_16_);
                  auVar101._0_4_ = (int)(auVar100._0_4_ + auVar96._0_4_);
                  auVar101._4_4_ = (int)(auVar100._4_4_ + auVar96._4_4_);
                  auVar101._8_4_ = (int)(auVar100._8_4_ + auVar96._8_4_);
                  auVar101._12_4_ = (int)(auVar100._12_4_ + auVar96._12_4_);
                  auVar83._0_4_ = (int)(auVar82._0_4_ + auVar115._0_4_);
                  auVar83._4_4_ = (int)(auVar82._4_4_ + auVar115._4_4_);
                  auVar83._8_4_ = (int)(auVar82._8_4_ + auVar115._8_4_);
                  auVar83._12_4_ = (int)(auVar82._12_4_ + auVar115._12_4_);
                  auVar96 = vpackssdw_avx(auVar101,auVar83);
                  auVar96 = vpminsw_avx(auVar96,_DAT_0053ec30);
                  auVar96 = vpmaxsw_avx(auVar96,_DAT_0053ec40);
                  auVar96 = vpacksswb_avx(auVar96,auVar96);
                  *(long *)*pauVar38 = auVar96._0_8_;
                  pauVar38 = (undefined1 (*) [16])((long)*pauVar38 + 8);
                }
              }
            }
            iVar30 = iVar30 + (int)uVar48 * 8;
          }
LAB_003b79b3:
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&opt_q);
          iVar24 = 0;
        }
      }
    }
    else {
      uVar47 = (this->super_ConvolutionDepthWise).num_output;
      iVar27 = (this->super_ConvolutionDepthWise).int8_scale_term;
      if (opt->use_packing_layout == true) {
        if (iVar27 < 0x65) {
          uVar48 = (ulong)((uint)((uVar47 & 3) == 0) * 3 + 1);
        }
        else {
          uVar48 = 1;
          if ((uVar47 & 7) == 0) {
            uVar48 = 8;
          }
        }
      }
      else {
        uVar48 = 1;
      }
      uVar11 = (uint)uVar48;
      uVar50 = (ulong)(uVar11 * 4);
      if (100 < iVar27) {
        uVar50 = uVar48;
      }
      Mat::create(top_blob,iVar30,iVar42,(int)uVar47 / (int)uVar11,uVar50,uVar11,opt->blob_allocator
                 );
      auVar19 = (undefined1  [32])opt_q._32_32_;
      sVar17 = local_2d8.cstep;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar46 = (this->super_ConvolutionDepthWise).group;
        uVar36 = (long)(int)uVar29 / (long)iVar46;
        uVar47 = (this->super_ConvolutionDepthWise).num_output / iVar46;
        if (opt->use_packing_layout == true) {
          uVar29 = 1;
          if ((uVar36 & 7) == 0) {
            uVar29 = _elempack_00;
          }
          if (iVar27 < 0x65) {
            _elempack = (uint)((uVar47 & 3) == 0) * 3 + 1;
          }
          else {
            _elempack = 1;
            if ((uVar47 & 7) == 0) {
              _elempack = _elempack_00;
            }
          }
        }
        else {
          uVar29 = 1;
          _elempack = uVar29;
        }
        piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
        opt_q.blob_allocator._4_4_ = local_2d8.refcount._4_4_;
        opt_q.blob_allocator._0_4_ = local_2d8.refcount._0_4_;
        opt_q._0_8_ = local_2d8.data;
        opt_q.workspace_allocator = (Allocator *)local_2d8.elemsize;
        opt_q.openmp_blocktime = local_2d8.elempack;
        opt_q.use_reserved_1 = (bool)(undefined1)local_2d8.w;
        opt_q.use_image_storage = (bool)local_2d8.w._1_1_;
        opt_q.use_tensor_storage = (bool)local_2d8.w._2_1_;
        opt_q.use_reserved_2 = (bool)local_2d8.w._3_1_;
        opt_q.vulkan_device_index = local_2d8.dims;
        opt_q.use_local_pool_allocator = (bool)(undefined1)local_2d8.d;
        opt_q.use_shader_local_memory = (bool)local_2d8.d._1_1_;
        opt_q.use_cooperative_matrix = (bool)local_2d8.d._2_1_;
        opt_q.use_winograd23_convolution = (bool)local_2d8.d._3_1_;
        opt_q.flush_denormals = local_2d8.h;
        opt_q._32_8_ = local_2d8.allocator;
        opt_q._60_4_ = auVar19._28_4_;
        opt_q.use_winograd43_convolution = (bool)(undefined1)local_2d8.c;
        opt_q.use_winograd63_convolution = (bool)local_2d8.c._1_1_;
        opt_q.use_a53_a55_optimized_kernel = (bool)local_2d8.c._2_1_;
        opt_q.use_fp16_uniform = (bool)local_2d8.c._3_1_;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + 1;
          UNLOCK();
        }
        local_340 = uVar36 & 0xffffffff;
        uVar43 = uVar36;
        if ((int)uVar29 < iVar34) {
          _top_rescale = *(void **)opt;
          pAStack_228 = opt->workspace_allocator;
          iStack_220 = opt->openmp_blocktime;
          unique0x10005e53 = opt->use_winograd_convolution;
          unique0x10005e54 = opt->use_sgemm_convolution;
          unique0x10005e55 = opt->use_int8_inference;
          unique0x10005e56 = opt->use_vulkan_compute;
          local_218 = *(Allocator **)&opt->use_bf16_storage;
          _iStack_210 = *(undefined8 *)&opt->vulkan_device_index;
          _iStack_208 = *(undefined8 *)&opt->flush_denormals;
          _iStack_200 = *(undefined8 *)&opt->use_winograd43_convolution;
          pAStack_230 = opt->workspace_allocator;
          convert_packing(&local_2d8,(Mat *)&opt_q,uVar29,(Option *)&top_rescale);
          if (opt_q._0_8_ != 0) {
            uVar43 = uVar36 & 0xffffffff;
            if ((long)(int)opt_q._56_4_ * sVar17 != 0) goto LAB_003b706f;
          }
          iVar24 = -100;
        }
        else {
LAB_003b706f:
          piVar3 = top_blob->refcount;
          _top_rescale = top_blob->data;
          pAStack_230 = (Allocator *)top_blob->refcount;
          pAStack_228 = (Allocator *)top_blob->elemsize;
          iStack_220 = top_blob->elempack;
          local_218 = top_blob->allocator;
          iStack_210 = top_blob->dims;
          iStack_20c = top_blob->w;
          iStack_208 = top_blob->h;
          iStack_204 = top_blob->d;
          iStack_200 = top_blob->c;
          local_1f8 = top_blob->cstep;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + 1;
            UNLOCK();
          }
          if (_elempack < uVar11) {
            local_308 = (byte)uVar48;
            Mat::create((Mat *)&top_rescale,iVar30,iVar42,
                        (this->super_ConvolutionDepthWise).num_output / (int)_elempack,
                        (ulong)((byte)((ushort)uVar50 / (ushort)local_308) * _elempack),_elempack,
                        opt->workspace_allocator);
            iVar24 = -100;
            if (_top_rescale != (void *)0x0) {
              uVar43 = uVar36 & 0xffffffff;
              if ((long)iStack_200 * local_1f8 != 0) goto LAB_003b714a;
            }
          }
          else {
LAB_003b714a:
            iVar46 = 0;
            iVar27 = 0;
            lVar35 = 0;
            do {
              auVar19 = (undefined1  [32])opt_q._32_32_;
              if ((this->super_ConvolutionDepthWise).group <= lVar35) {
                if (_elempack < uVar11) {
                  convert_packing((Mat *)&top_rescale,top_blob,uVar11,opt);
                  iVar24 = -100;
                  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
                  break;
                }
                else if ((Mat *)&top_rescale != top_blob) {
                  if (pAStack_230 != (Allocator *)0x0) {
                    LOCK();
                    *(int *)&pAStack_230->_vptr_Allocator =
                         *(int *)&pAStack_230->_vptr_Allocator + 1;
                    UNLOCK();
                  }
                  piVar3 = top_blob->refcount;
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      if (top_blob->allocator == (Allocator *)0x0) {
                        free(top_blob->data);
                      }
                      else {
                        (*top_blob->allocator->_vptr_Allocator[3])();
                      }
                    }
                  }
                  top_blob->data = _top_rescale;
                  top_blob->refcount = (int *)pAStack_230;
                  top_blob->elemsize = (size_t)pAStack_228;
                  top_blob->elempack = iStack_220;
                  top_blob->allocator = local_218;
                  top_blob->dims = iStack_210;
                  top_blob->w = iStack_20c;
                  top_blob->h = iStack_208;
                  top_blob->d = iStack_204;
                  top_blob->c = iStack_200;
                  top_blob->cstep = local_1f8;
                }
                iVar24 = 0;
                break;
              }
              local_178 = (int)uVar43 / (int)uVar29;
              _scale_out = (void *)((long)(iVar46 / (int)uVar29) * sVar17 *
                                    (long)opt_q.workspace_allocator + opt_q._0_8_);
              local_1a8 = (int *)0x0;
              local_1a0 = opt_q.workspace_allocator;
              local_198 = opt_q.openmp_blocktime;
              local_190 = (long *)opt_q._32_8_;
              uVar18 = opt_q._40_8_;
              uVar20 = opt_q._48_8_;
              local_170 = ((long)(int)opt_q._52_4_ * (long)opt_q.workspace_allocator *
                           (long)opt_q.flush_denormals * (long)(int)opt_q._44_4_ + 0xfU &
                          0xfffffffffffffff0) / (ulong)opt_q.workspace_allocator;
              opt_q.vulkan_device_index = (int)uVar18;
              opt_q.use_reserved_1 = SUB81(uVar18,4);
              opt_q.use_image_storage = SUB81(uVar18,5);
              opt_q.use_tensor_storage = SUB81(uVar18,6);
              opt_q.use_reserved_2 = SUB81(uVar18,7);
              local_188 = opt_q.vulkan_device_index;
              bStack_184 = opt_q.use_reserved_1;
              bStack_183 = opt_q.use_image_storage;
              bStack_182 = opt_q.use_tensor_storage;
              bStack_181 = opt_q.use_reserved_2;
              opt_q.flush_denormals = (int)uVar20;
              opt_q.use_local_pool_allocator = SUB81(uVar20,4);
              opt_q.use_shader_local_memory = SUB81(uVar20,5);
              opt_q.use_cooperative_matrix = SUB81(uVar20,6);
              opt_q.use_winograd23_convolution = SUB81(uVar20,7);
              iStack_180 = opt_q.flush_denormals;
              bStack_17c = opt_q.use_local_pool_allocator;
              bStack_17b = opt_q.use_shader_local_memory;
              bStack_17a = opt_q.use_cooperative_matrix;
              bStack_179 = opt_q.use_winograd23_convolution;
              m_1.c = (int)uVar47 / (int)_elempack;
              m_1.data = (void *)((long)(iVar27 / (int)_elempack) * local_1f8 * (long)pAStack_228 +
                                 (long)_top_rescale);
              m_1.refcount = (int *)0x0;
              m_1.elemsize = (size_t)pAStack_228;
              m_1.elempack = iStack_220;
              m_1.allocator = local_218;
              m_1.cstep = ((long)iStack_204 * (long)pAStack_228 *
                           (long)iStack_208 * (long)iStack_20c + 0xfU & 0xfffffffffffffff0) /
                          (ulong)pAStack_228;
              m_1.dims = iStack_210;
              m_1.w = iStack_20c;
              m_1.h = iStack_208;
              m_1.d = iStack_204;
              pLVar8 = (this->group_ops).
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar35];
              opt_g.lightmode = opt->lightmode;
              opt_g.use_shader_pack8 = opt->use_shader_pack8;
              opt_g.use_subgroup_ops = opt->use_subgroup_ops;
              opt_g.use_reserved_0 = opt->use_reserved_0;
              opt_g.num_threads = opt->num_threads;
              opt_g.workspace_allocator = opt->workspace_allocator;
              opt_g.openmp_blocktime = opt->openmp_blocktime;
              opt_g.use_winograd_convolution = opt->use_winograd_convolution;
              opt_g.use_sgemm_convolution = opt->use_sgemm_convolution;
              opt_g.use_int8_inference = opt->use_int8_inference;
              opt_g.use_vulkan_compute = opt->use_vulkan_compute;
              opt_g.use_bf16_storage = opt->use_bf16_storage;
              opt_g.use_fp16_packed = opt->use_fp16_packed;
              opt_g.use_fp16_storage = opt->use_fp16_storage;
              opt_g.use_fp16_arithmetic = opt->use_fp16_arithmetic;
              opt_g.use_int8_packed = opt->use_int8_packed;
              opt_g.use_int8_storage = opt->use_int8_storage;
              opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
              opt_g.use_packing_layout = opt->use_packing_layout;
              opt_g.vulkan_device_index = opt->vulkan_device_index;
              opt_g.use_reserved_1 = opt->use_reserved_1;
              opt_g.use_image_storage = opt->use_image_storage;
              opt_g.use_tensor_storage = opt->use_tensor_storage;
              opt_g.use_reserved_2 = opt->use_reserved_2;
              opt_g.flush_denormals = opt->flush_denormals;
              opt_g.use_local_pool_allocator = opt->use_local_pool_allocator;
              opt_g.use_shader_local_memory = opt->use_shader_local_memory;
              opt_g.use_cooperative_matrix = opt->use_cooperative_matrix;
              opt_g.use_winograd23_convolution = opt->use_winograd23_convolution;
              opt_g.use_winograd43_convolution = opt->use_winograd43_convolution;
              opt_g.use_winograd63_convolution = opt->use_winograd63_convolution;
              opt_g.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
              opt_g.use_fp16_uniform = opt->use_fp16_uniform;
              opt_g.use_int8_uniform = opt->use_int8_uniform;
              opt_g.use_reserved_9 = opt->use_reserved_9;
              opt_g.use_reserved_10 = opt->use_reserved_10;
              opt_g.use_reserved_11 = opt->use_reserved_11;
              opt_g.blob_allocator = local_218;
              opt_q._32_32_ = auVar19;
              iVar24 = (*pLVar8->_vptr_Layer[7])(pLVar8,&scale_out,&m_1,&opt_g);
              if (m_1.refcount != (int *)0x0) {
                LOCK();
                *m_1.refcount = *m_1.refcount + -1;
                UNLOCK();
                if (*m_1.refcount == 0) {
                  if (m_1.allocator == (Allocator *)0x0) {
                    free(m_1.data);
                  }
                  else {
                    (*(m_1.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              if (local_1a8 != (int *)0x0) {
                LOCK();
                *local_1a8 = *local_1a8 + -1;
                UNLOCK();
                if (*local_1a8 == 0) {
                  if (local_190 == (long *)0x0) {
                    free(_scale_out);
                  }
                  else {
                    (**(code **)(*local_190 + 0x18))();
                  }
                }
              }
              lVar35 = lVar35 + 1;
              iVar27 = iVar27 + uVar47;
              iVar46 = iVar46 + (int)uVar36;
              uVar43 = local_340;
            } while (iVar24 == 0);
          }
          if (pAStack_230 != (Allocator *)0x0) {
            LOCK();
            *(int *)&pAStack_230->_vptr_Allocator = *(int *)&pAStack_230->_vptr_Allocator + -1;
            UNLOCK();
            if (*(int *)&pAStack_230->_vptr_Allocator == 0) {
              if (local_218 == (Allocator *)0x0) {
                free(_top_rescale);
              }
              else {
                (*local_218->_vptr_Allocator[3])();
              }
            }
          }
        }
        if (opt_q.blob_allocator != (Allocator *)0x0) {
          LOCK();
          *(int *)&(opt_q.blob_allocator)->_vptr_Allocator =
               *(int *)&(opt_q.blob_allocator)->_vptr_Allocator + -1;
          UNLOCK();
          if (*(int *)&(opt_q.blob_allocator)->_vptr_Allocator == 0) {
            if (opt_q._32_8_ == 0) {
              free((void *)opt_q._0_8_);
            }
            else {
              (**(code **)(*(long *)opt_q._32_8_ + 0x18))();
            }
          }
        }
      }
    }
  }
  piVar3 = (int *)CONCAT44(local_2d8.refcount._4_4_,local_2d8.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_2d8.allocator == (Allocator *)0x0) {
        free(local_2d8.data);
      }
      else {
        (*(local_2d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003b8592:
  if (local_168.refcount != (int *)0x0) {
    LOCK();
    *local_168.refcount = *local_168.refcount + -1;
    UNLOCK();
    if (*local_168.refcount == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        free(local_168.data);
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int ConvolutionDepthWise_x86_avx::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
        if (bottom_blob_int8.empty())
            return -100;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_tm + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    bool use_int8_requantize = int8_scale_term > 100;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        if (use_int8_requantize)
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        else
            out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        if (use_int8_requantize)
            out_g_elempack = num_output_g % 8 == 0 ? 8 : 1;
        else
            out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
        if (bottom_blob_bordered_unpacked.empty())
            return -100;
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob_unpacked.allocator;

        // forward
        int ret = op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
        if (ret != 0)
            return ret;
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
        if (top_blob.empty())
            return -100;
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}